

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg.cpp
# Opt level: O2

AggregateFunction *
duckdb::GetAverageAggregate(AggregateFunction *__return_storage_ptr__,PhysicalType type)

{
  InternalException *this;
  int iVar1;
  undefined7 in_register_00000031;
  LogicalType *this_00;
  FunctionNullHandling in_R8B;
  allocator local_b1;
  undefined1 local_b0 [56];
  LogicalType local_78;
  LogicalType local_60;
  LogicalType local_48;
  LogicalType local_30;
  
  iVar1 = (int)CONCAT71(in_register_00000031,type);
  if (iVar1 == 0xcc) {
    LogicalType::LogicalType((LogicalType *)local_b0,HUGEINT);
    LogicalType::LogicalType(&local_78,DOUBLE);
    AggregateFunction::
    UnaryAggregate<duckdb::AvgState<duckdb::hugeint_t>,duckdb::hugeint_t,double,duckdb::HugeintAverageOperation,(duckdb::AggregateDestructorType)0>
              (__return_storage_ptr__,(AggregateFunction *)local_b0,&local_78,(LogicalType *)0x0,
               in_R8B);
    this_00 = &local_78;
  }
  else if (iVar1 == 7) {
    LogicalType::LogicalType((LogicalType *)local_b0,INTEGER);
    LogicalType::LogicalType(&local_48,DOUBLE);
    AggregateFunction::
    UnaryAggregate<duckdb::AvgState<duckdb::hugeint_t>,int,double,duckdb::IntegerAverageOperationHugeint,(duckdb::AggregateDestructorType)0>
              (__return_storage_ptr__,(AggregateFunction *)local_b0,&local_48,(LogicalType *)0x0,
               in_R8B);
    this_00 = &local_48;
  }
  else if (iVar1 == 9) {
    LogicalType::LogicalType((LogicalType *)local_b0,BIGINT);
    LogicalType::LogicalType(&local_60,DOUBLE);
    AggregateFunction::
    UnaryAggregate<duckdb::AvgState<duckdb::hugeint_t>,long,double,duckdb::IntegerAverageOperationHugeint,(duckdb::AggregateDestructorType)0>
              (__return_storage_ptr__,(AggregateFunction *)local_b0,&local_60,(LogicalType *)0x0,
               in_R8B);
    this_00 = &local_60;
  }
  else if (iVar1 == 0x15) {
    LogicalType::LogicalType((LogicalType *)local_b0,INTERVAL);
    LogicalType::LogicalType((LogicalType *)(local_b0 + 0x20),INTERVAL);
    AggregateFunction::
    UnaryAggregate<duckdb::IntervalAvgState,duckdb::interval_t,duckdb::interval_t,duckdb::IntervalAverageOperation,(duckdb::AggregateDestructorType)0>
              (__return_storage_ptr__,(AggregateFunction *)local_b0,(LogicalType *)(local_b0 + 0x20)
               ,(LogicalType *)0x0,in_R8B);
    this_00 = (LogicalType *)(local_b0 + 0x20);
  }
  else {
    if (iVar1 != 5) {
      this = (InternalException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string((string *)local_b0,"Unimplemented average aggregate",&local_b1)
      ;
      InternalException::InternalException(this,(string *)local_b0);
      __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    LogicalType::LogicalType((LogicalType *)local_b0,SMALLINT);
    LogicalType::LogicalType(&local_30,DOUBLE);
    AggregateFunction::
    UnaryAggregate<duckdb::AvgState<long>,short,double,duckdb::IntegerAverageOperation,(duckdb::AggregateDestructorType)0>
              (__return_storage_ptr__,(AggregateFunction *)local_b0,&local_30,(LogicalType *)0x0,
               in_R8B);
    this_00 = &local_30;
  }
  LogicalType::~LogicalType(this_00);
  LogicalType::~LogicalType((LogicalType *)local_b0);
  return __return_storage_ptr__;
}

Assistant:

AggregateFunction GetAverageAggregate(PhysicalType type) {
	switch (type) {
	case PhysicalType::INT16: {
		return AggregateFunction::UnaryAggregate<AvgState<int64_t>, int16_t, double, IntegerAverageOperation>(
		    LogicalType::SMALLINT, LogicalType::DOUBLE);
	}
	case PhysicalType::INT32: {
		return AggregateFunction::UnaryAggregate<AvgState<hugeint_t>, int32_t, double, IntegerAverageOperationHugeint>(
		    LogicalType::INTEGER, LogicalType::DOUBLE);
	}
	case PhysicalType::INT64: {
		return AggregateFunction::UnaryAggregate<AvgState<hugeint_t>, int64_t, double, IntegerAverageOperationHugeint>(
		    LogicalType::BIGINT, LogicalType::DOUBLE);
	}
	case PhysicalType::INT128: {
		return AggregateFunction::UnaryAggregate<AvgState<hugeint_t>, hugeint_t, double, HugeintAverageOperation>(
		    LogicalType::HUGEINT, LogicalType::DOUBLE);
	}
	case PhysicalType::INTERVAL: {
		return AggregateFunction::UnaryAggregate<IntervalAvgState, interval_t, interval_t, IntervalAverageOperation>(
		    LogicalType::INTERVAL, LogicalType::INTERVAL);
	}
	default:
		throw InternalException("Unimplemented average aggregate");
	}
}